

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBufferWithStructuredProtoField<(absl::lts_20250127::log_internal::LogMessage::StringType)1>
          (LogMessage *this,StructuredProtoField field,string_view str)

{
  StructuredProtoField field_00;
  string_view value;
  bool bVar1;
  pointer pLVar2;
  Span<char> *pSVar3;
  size_t sVar4;
  size_t sVar5;
  size_type sVar6;
  Span<char> *pSVar7;
  Span<char> SVar8;
  undefined8 in_stack_ffffffffffffff18;
  log_internal *local_70;
  Span<char> start;
  uint8_t tag_value;
  size_t encoded_field_size;
  Span<char> encoded_remaining_copy;
  LogMessage *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (LogMessage *)str._M_len;
  encoded_remaining_copy.len_ = (size_type)this;
  pLVar2 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  pSVar3 = LogMessageData::encoded_remaining(pLVar2);
  encoded_field_size = (size_t)pSVar3->ptr_;
  encoded_remaining_copy.ptr_ = (pointer)pSVar3->len_;
  field_00.value.
  super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  .
  super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  .
  super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  .
  super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  .
  super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  .
  super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  ._16_8_ = in_stack_ffffffffffffff18;
  field_00._0_24_ =
       field.value.
       super__Variant_base<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_assign_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Move_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Copy_ctor_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
       .
       super__Variant_storage_alias<std::variant<unsigned_long,_long,_unsigned_int,_int,_bool>,_std::variant<unsigned_long,_long,_double>,_absl::lts_20250127::Span<const_char>,_std::variant<unsigned_int,_int,_float>_>
  ;
  sVar4 = BufferSizeForStructuredProtoField(field_00);
  sVar5 = BufferSizeFor(1,kLengthDelimited);
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  SVar8 = EncodeMessageStart(7,sVar4 + sVar5 + sVar6,(Span<char> *)&encoded_field_size);
  bVar1 = EncodeStructuredProtoField(field,(Span<char> *)&encoded_field_size);
  if (bVar1) {
    value._M_str = (char *)str_local._M_len;
    value._M_len = (size_t)this_local;
    pSVar3 = (Span<char> *)&encoded_field_size;
    bVar1 = EncodeStringTruncate(1,value,pSVar3);
    if (bVar1) {
      local_70 = (log_internal *)SVar8.ptr_;
      start.ptr_ = (pointer)SVar8.len_;
      SVar8.len_ = (size_type)&encoded_field_size;
      SVar8.ptr_ = start.ptr_;
      EncodeMessageLength(local_70,SVar8,pSVar3);
      pLVar2 = std::
               unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ::operator->(&this->data_);
      pSVar3 = LogMessageData::encoded_remaining(pLVar2);
      pSVar3->ptr_ = (pointer)encoded_field_size;
      pSVar3->len_ = (size_type)encoded_remaining_copy.ptr_;
    }
    else {
      pLVar2 = std::
               unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ::operator->(&this->data_);
      pSVar3 = LogMessageData::encoded_remaining(pLVar2);
      pLVar2 = std::
               unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ::operator->(&this->data_);
      pSVar7 = LogMessageData::encoded_remaining(pLVar2);
      sVar6 = Span<char>::size(pSVar7);
      Span<char>::remove_suffix(pSVar3,sVar6);
    }
  }
  else {
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar3 = LogMessageData::encoded_remaining(pLVar2);
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar7 = LogMessageData::encoded_remaining(pLVar2);
    sVar6 = Span<char>::size(pSVar7);
    Span<char>::remove_suffix(pSVar3,sVar6);
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBufferWithStructuredProtoField(
    StructuredProtoField field, absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  size_t encoded_field_size = BufferSizeForStructuredProtoField(field);
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      encoded_field_size +
          BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);

  // Write the encoded proto field.
  if (!EncodeStructuredProtoField(field, encoded_remaining_copy)) {
    // The header / field will not fit; zero `encoded_remaining()` so we
    // don't write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  // Write the string, truncating if necessary.
  if (!EncodeStringTruncate(ValueTag::kString, str, &encoded_remaining_copy)) {
    // The length of the string itself did not fit; zero `encoded_remaining()`
    // so the value is not encoded at all.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
    return;
  }

  EncodeMessageLength(start, &encoded_remaining_copy);
  data_->encoded_remaining() = encoded_remaining_copy;
}